

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlStringLenDecodeEntities
                    (xmlParserCtxtPtr ctxt,xmlChar *str,int len,int what,xmlChar end,xmlChar end2,
                    xmlChar end3)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  ulong uVar3;
  void *pvVar4;
  int *piVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlChar *pxVar8;
  size_t sVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  bool bVar12;
  size_t new_size_5;
  xmlChar *tmp_5;
  size_t new_size_4;
  xmlChar *tmp_4;
  size_t new_size_3;
  xmlChar *tmp_3;
  xmlChar *cur;
  int i;
  size_t new_size_2;
  xmlChar *tmp_2;
  size_t new_size_1;
  xmlChar *tmp_1;
  size_t new_size;
  xmlChar *tmp;
  int local_70;
  int val;
  int l;
  int c;
  xmlEntityPtr ent;
  xmlChar *last;
  xmlChar *rep;
  xmlChar *current;
  size_t nbchars;
  size_t buffer_size;
  xmlChar *buffer;
  uint local_28;
  xmlChar end2_local;
  int iStack_24;
  xmlChar end_local;
  int what_local;
  int len_local;
  xmlChar *str_local;
  xmlParserCtxtPtr ctxt_local;
  
  buffer_size = 0;
  nbchars = 0;
  current = (xmlChar *)0x0;
  rep = (xmlChar *)0x0;
  last = (xmlChar *)0x0;
  if (((ctxt != (xmlParserCtxtPtr)0x0) && (str != (xmlChar *)0x0)) && (-1 < len)) {
    ent = (xmlEntityPtr)(str + len);
    buffer._6_1_ = end2;
    buffer._7_1_ = end;
    local_28 = what;
    iStack_24 = len;
    _what_local = (xmlEntityPtr)str;
    str_local = (xmlChar *)ctxt;
    if (((ctxt->depth < 0x29) || ((ctxt->options & 0x80000U) != 0)) && (ctxt->depth < 0x401)) {
      nbchars = 300;
      buffer_size = (size_t)(*xmlMallocAtomic)(300);
      if ((void *)buffer_size != (void *)0x0) {
        if (_what_local < ent) {
          val = xmlStringCurrentChar((xmlParserCtxtPtr)str_local,(xmlChar *)_what_local,&local_70);
        }
        else {
          val = 0;
        }
        do {
          bVar12 = false;
          if (((val != 0) && (bVar12 = false, val != (uint)buffer._7_1_)) &&
             ((bVar12 = false, val != (uint)buffer._6_1_ && (bVar12 = false, val != (uint)end3)))) {
            bVar12 = *(int *)(str_local + 0x110) != -1;
          }
          if ((!bVar12) || (val == 0)) {
            current[buffer_size] = '\0';
            return (xmlChar *)buffer_size;
          }
          if ((val == 0x26) && (*(char *)((long)&_what_local->_private + 1) == '#')) {
            iVar2 = xmlParseStringCharRef((xmlParserCtxtPtr)str_local,(xmlChar **)&what_local);
            if (iVar2 == 0) goto LAB_00175dc3;
            iVar2 = xmlCopyCharMultiByte(current + buffer_size,iVar2);
            current = current + iVar2;
            uVar3 = nbchars;
            pvVar4 = (void *)buffer_size;
            if (nbchars < current + 100) {
              uVar3 = nbchars * 2 + 100;
              if (uVar3 < nbchars) break;
              pvVar4 = (*xmlRealloc)((void *)buffer_size,uVar3);
joined_r0x00175d54:
              if (pvVar4 == (void *)0x0) break;
            }
          }
          else if ((val == 0x26) && ((local_28 & 1) != 0)) {
            piVar5 = __xmlParserDebugEntities();
            if (*piVar5 != 0) {
              pp_Var6 = __xmlGenericError();
              p_Var1 = *pp_Var6;
              ppvVar7 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar7,"String decoding Entity Reference: %.30s\n",_what_local);
            }
            _l = xmlParseStringEntityRef((xmlParserCtxtPtr)str_local,(xmlChar **)&what_local);
            xmlParserEntityCheck((xmlParserCtxtPtr)str_local,0,_l,0);
            if ((_l == (xmlEntityPtr)0x0) ||
               (*(long *)(str_local + 0x2b8) =
                     (long)(_l->checked / 2) + *(long *)(str_local + 0x2b8),
               _l->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
              if ((_l == (xmlEntityPtr)0x0) || (_l->content == (xmlChar *)0x0)) {
                uVar3 = nbchars;
                pvVar4 = (void *)buffer_size;
                if (_l != (xmlEntityPtr)0x0) {
                  cur._4_4_ = xmlStrlen(_l->name);
                  tmp_3 = _l->name;
                  pxVar10 = current + 1;
                  current[buffer_size] = '&';
                  current = pxVar10;
                  pvVar4 = (void *)buffer_size;
                  sVar9 = nbchars;
                  if ((nbchars < pxVar10 + (long)cur._4_4_ + 100) &&
                     ((sVar9 = nbchars * 2 + (long)cur._4_4_ + 100, sVar9 < nbchars ||
                      (pvVar4 = (*xmlRealloc)((void *)buffer_size,sVar9), pvVar4 == (void *)0x0))))
                  break;
                  for (; nbchars = sVar9, buffer_size = (size_t)pvVar4, 0 < cur._4_4_;
                      cur._4_4_ = cur._4_4_ + -1) {
                    current[buffer_size] = *tmp_3;
                    tmp_3 = tmp_3 + 1;
                    current = current + 1;
                    pvVar4 = (void *)buffer_size;
                    sVar9 = nbchars;
                  }
                  current[buffer_size] = ';';
                  current = current + 1;
                  uVar3 = nbchars;
                  pvVar4 = (void *)buffer_size;
                }
              }
              else {
                *(int *)(str_local + 0x188) = *(int *)(str_local + 0x188) + 1;
                last = xmlStringDecodeEntities
                                 ((xmlParserCtxtPtr)str_local,_l->content,local_28,'\0','\0','\0');
                *(int *)(str_local + 0x188) = *(int *)(str_local + 0x188) + -1;
                pxVar10 = last;
                sVar9 = nbchars;
                pvVar4 = (void *)buffer_size;
                if (last == (xmlChar *)0x0) goto LAB_00175dc3;
                while (buffer_size = (size_t)pvVar4, nbchars = sVar9, rep = pxVar10, *rep != '\0') {
                  pxVar11 = current + 1;
                  current[buffer_size] = *rep;
                  pxVar8 = current + 0x65;
                  pxVar10 = rep + 1;
                  current = pxVar11;
                  sVar9 = nbchars;
                  pvVar4 = (void *)buffer_size;
                  if (nbchars < pxVar8) {
                    rep = rep + 1;
                    iVar2 = xmlParserEntityCheck((xmlParserCtxtPtr)str_local,(size_t)pxVar11,_l,0);
                    if (iVar2 != 0) goto LAB_00175dc3;
                    sVar9 = nbchars * 2 + 100;
                    if ((sVar9 < nbchars) ||
                       (pvVar4 = (*xmlRealloc)((void *)buffer_size,sVar9), pxVar10 = rep,
                       pvVar4 == (void *)0x0)) goto LAB_00175db6;
                  }
                }
                (*xmlFree)(last);
                last = (xmlChar *)0x0;
                uVar3 = nbchars;
                pvVar4 = (void *)buffer_size;
              }
            }
            else {
              if (_l->content == (xmlChar *)0x0) {
                xmlFatalErrMsg((xmlParserCtxtPtr)str_local,XML_ERR_INTERNAL_ERROR,
                               "predefined entity has no content\n");
                goto LAB_00175dc3;
              }
              iVar2 = xmlCopyCharMultiByte(current + buffer_size,(uint)*_l->content);
              current = current + iVar2;
              uVar3 = nbchars;
              pvVar4 = (void *)buffer_size;
              if (nbchars < current + 100) {
                uVar3 = nbchars * 2 + 100;
                if (nbchars <= uVar3) {
                  pvVar4 = (*xmlRealloc)((void *)buffer_size,uVar3);
                  goto joined_r0x00175d54;
                }
                break;
              }
            }
          }
          else if ((val == 0x25) && ((local_28 & 2) != 0)) {
            piVar5 = __xmlParserDebugEntities();
            if (*piVar5 != 0) {
              pp_Var6 = __xmlGenericError();
              p_Var1 = *pp_Var6;
              ppvVar7 = __xmlGenericErrorContext();
              (*p_Var1)(*ppvVar7,"String decoding PE Reference: %.30s\n",_what_local);
            }
            _l = xmlParseStringPEReference((xmlParserCtxtPtr)str_local,(xmlChar **)&what_local);
            xmlParserEntityCheck((xmlParserCtxtPtr)str_local,0,_l,0);
            uVar3 = nbchars;
            pvVar4 = (void *)buffer_size;
            if (_l != (xmlEntityPtr)0x0) {
              *(long *)(str_local + 0x2b8) = (long)(_l->checked / 2) + *(long *)(str_local + 0x2b8);
              if (_l->content == (xmlChar *)0x0) {
                if ((((*(uint *)(str_local + 0x234) & 2) == 0) &&
                    ((*(uint *)(str_local + 0x234) & 0x10) == 0)) &&
                   (*(int *)(str_local + 0x9c) == 0)) {
                  xmlWarningMsg((xmlParserCtxtPtr)str_local,XML_ERR_ENTITY_PROCESSING,
                                "not validating will not read content for PE entity %s\n",_l->name,
                                (xmlChar *)0x0);
                }
                else {
                  xmlLoadEntityContent((xmlParserCtxtPtr)str_local,_l);
                }
              }
              *(int *)(str_local + 0x188) = *(int *)(str_local + 0x188) + 1;
              last = xmlStringDecodeEntities
                               ((xmlParserCtxtPtr)str_local,_l->content,local_28,'\0','\0','\0');
              *(int *)(str_local + 0x188) = *(int *)(str_local + 0x188) + -1;
              pxVar10 = last;
              sVar9 = nbchars;
              pvVar4 = (void *)buffer_size;
              if (last == (xmlChar *)0x0) goto LAB_00175dc3;
              while (buffer_size = (size_t)pvVar4, nbchars = sVar9, rep = pxVar10, *rep != '\0') {
                pxVar11 = current + 1;
                current[buffer_size] = *rep;
                pxVar8 = current + 0x65;
                pxVar10 = rep + 1;
                current = pxVar11;
                sVar9 = nbchars;
                pvVar4 = (void *)buffer_size;
                if (nbchars < pxVar8) {
                  rep = rep + 1;
                  iVar2 = xmlParserEntityCheck((xmlParserCtxtPtr)str_local,(size_t)pxVar11,_l,0);
                  if (iVar2 != 0) goto LAB_00175dc3;
                  sVar9 = nbchars * 2 + 100;
                  if ((sVar9 < nbchars) ||
                     (pvVar4 = (*xmlRealloc)((void *)buffer_size,sVar9), pxVar10 = rep,
                     pvVar4 == (void *)0x0)) goto LAB_00175db6;
                }
              }
              (*xmlFree)(last);
              last = (xmlChar *)0x0;
              uVar3 = nbchars;
              pvVar4 = (void *)buffer_size;
            }
          }
          else {
            if (local_70 == 1) {
              current[buffer_size] = (xmlChar)val;
              current = current + 1;
            }
            else {
              iVar2 = xmlCopyCharMultiByte(current + buffer_size,val);
              current = current + iVar2;
            }
            _what_local = (xmlEntityPtr)((long)&_what_local->_private + (long)local_70);
            uVar3 = nbchars;
            pvVar4 = (void *)buffer_size;
            if (nbchars < current + 100) {
              uVar3 = nbchars * 2 + 100;
              if (nbchars <= uVar3) {
                pvVar4 = (*xmlRealloc)((void *)buffer_size,uVar3);
                goto joined_r0x00175d54;
              }
              break;
            }
          }
          buffer_size = (size_t)pvVar4;
          nbchars = uVar3;
          if (_what_local < ent) {
            val = xmlStringCurrentChar((xmlParserCtxtPtr)str_local,(xmlChar *)_what_local,&local_70)
            ;
          }
          else {
            val = 0;
          }
        } while( true );
      }
LAB_00175db6:
      xmlErrMemory((xmlParserCtxtPtr)str_local,(char *)0x0);
LAB_00175dc3:
      if (last != (xmlChar *)0x0) {
        (*xmlFree)(last);
      }
      if (buffer_size != 0) {
        (*xmlFree)((void *)buffer_size);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlStringLenDecodeEntities(xmlParserCtxtPtr ctxt, const xmlChar *str, int len,
		      int what, xmlChar end, xmlChar  end2, xmlChar end3) {
    xmlChar *buffer = NULL;
    size_t buffer_size = 0;
    size_t nbchars = 0;

    xmlChar *current = NULL;
    xmlChar *rep = NULL;
    const xmlChar *last;
    xmlEntityPtr ent;
    int c,l;

    if ((ctxt == NULL) || (str == NULL) || (len < 0))
	return(NULL);
    last = str + len;

    if (((ctxt->depth > 40) &&
         ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
	(ctxt->depth > 1024)) {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
	return(NULL);
    }

    /*
     * allocate a translation buffer.
     */
    buffer_size = XML_PARSER_BIG_BUFFER_SIZE;
    buffer = (xmlChar *) xmlMallocAtomic(buffer_size);
    if (buffer == NULL) goto mem_error;

    /*
     * OK loop until we reach one of the ending char or a size limit.
     * we are operating on already parsed values.
     */
    if (str < last)
	c = CUR_SCHAR(str, l);
    else
        c = 0;
    while ((c != 0) && (c != end) && /* non input consuming loop */
           (c != end2) && (c != end3) &&
           (ctxt->instate != XML_PARSER_EOF)) {

	if (c == 0) break;
        if ((c == '&') && (str[1] == '#')) {
	    int val = xmlParseStringCharRef(ctxt, &str);
	    if (val == 0)
                goto int_error;
	    COPY_BUF(0,buffer,nbchars,val);
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	} else if ((c == '&') && (what & XML_SUBSTITUTE_REF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding Entity Reference: %.30s\n",
			str);
	    ent = xmlParseStringEntityRef(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if ((ent != NULL) &&
		(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {
		if (ent->content != NULL) {
		    COPY_BUF(0,buffer,nbchars,ent->content[0]);
		    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
			growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
		    }
		} else {
		    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			    "predefined entity has no content\n");
                    goto int_error;
		}
	    } else if ((ent != NULL) && (ent->content != NULL)) {
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL)
                    goto int_error;

                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    } else if (ent != NULL) {
		int i = xmlStrlen(ent->name);
		const xmlChar *cur = ent->name;

		buffer[nbchars++] = '&';
		if (nbchars + i + XML_PARSER_BUFFER_SIZE > buffer_size) {
		    growBuffer(buffer, i + XML_PARSER_BUFFER_SIZE);
		}
		for (;i > 0;i--)
		    buffer[nbchars++] = *cur++;
		buffer[nbchars++] = ';';
	    }
	} else if (c == '%' && (what & XML_SUBSTITUTE_PEREF)) {
	    if (xmlParserDebugEntities)
		xmlGenericError(xmlGenericErrorContext,
			"String decoding PE Reference: %.30s\n", str);
	    ent = xmlParseStringPEReference(ctxt, &str);
	    xmlParserEntityCheck(ctxt, 0, ent, 0);
	    if (ent != NULL)
	        ctxt->nbentities += ent->checked / 2;
	    if (ent != NULL) {
                if (ent->content == NULL) {
		    /*
		     * Note: external parsed entities will not be loaded,
		     * it is not required for a non-validating parser to
		     * complete external PEReferences coming from the
		     * internal subset
		     */
		    if (((ctxt->options & XML_PARSE_NOENT) != 0) ||
			((ctxt->options & XML_PARSE_DTDVALID) != 0) ||
			(ctxt->validate != 0)) {
			xmlLoadEntityContent(ctxt, ent);
		    } else {
			xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
		  "not validating will not read content for PE entity %s\n",
		                      ent->name, NULL);
		    }
		}
		ctxt->depth++;
		rep = xmlStringDecodeEntities(ctxt, ent->content, what,
			                      0, 0, 0);
		ctxt->depth--;
		if (rep == NULL)
                    goto int_error;
                current = rep;
                while (*current != 0) { /* non input consuming loop */
                    buffer[nbchars++] = *current++;
                    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
                        if (xmlParserEntityCheck(ctxt, nbchars, ent, 0))
                            goto int_error;
                        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
                    }
                }
                xmlFree(rep);
                rep = NULL;
	    }
	} else {
	    COPY_BUF(l,buffer,nbchars,c);
	    str += l;
	    if (nbchars + XML_PARSER_BUFFER_SIZE > buffer_size) {
	        growBuffer(buffer, XML_PARSER_BUFFER_SIZE);
	    }
	}
	if (str < last)
	    c = CUR_SCHAR(str, l);
	else
	    c = 0;
    }
    buffer[nbchars] = 0;
    return(buffer);

mem_error:
    xmlErrMemory(ctxt, NULL);
int_error:
    if (rep != NULL)
        xmlFree(rep);
    if (buffer != NULL)
        xmlFree(buffer);
    return(NULL);
}